

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void duckdb::RLEScanPartialInternal<unsigned_long,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint uVar1;
  _func_int *p_Var2;
  idx_t iVar3;
  data_ptr_t pdVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  pointer pSVar8;
  ulong uVar9;
  ulong uVar10;
  _func_int **pp_Var11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pSVar8 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar8 + 3));
  p_Var2 = pSVar8[3]._vptr_SegmentScanState[2];
  iVar3 = segment->offset;
  uVar1 = *(uint *)&pSVar8[6]._vptr_SegmentScanState;
  pdVar4 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  auVar7 = _DAT_0135a310;
  auVar6 = _DAT_01352200;
  uVar15 = scan_count + result_offset;
  do {
    uVar9 = uVar15 - result_offset;
    if (uVar15 < result_offset || uVar9 == 0) {
      return;
    }
    pp_Var11 = (_func_int **)
               (ulong)*(ushort *)
                       (p_Var2 + (long)pSVar8[4]._vptr_SegmentScanState * 2 + uVar1 + iVar3);
    uVar10 = (long)pp_Var11 - (long)pSVar8[5]._vptr_SegmentScanState;
    uVar5 = *(undefined8 *)(p_Var2 + (long)pSVar8[4]._vptr_SegmentScanState * 8 + iVar3 + 8);
    if (uVar9 < uVar10) {
      lVar12 = uVar9 + (uVar9 == 0);
      lVar13 = lVar12 + -1;
      auVar17._8_4_ = (int)lVar13;
      auVar17._0_8_ = lVar13;
      auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
      auVar17 = auVar17 ^ auVar6;
      uVar14 = 0;
      auVar18 = auVar7;
      do {
        auVar19 = auVar18 ^ auVar6;
        if ((bool)(~(auVar17._4_4_ < auVar19._4_4_ ||
                    auVar17._0_4_ < auVar19._0_4_ && auVar19._4_4_ == auVar17._4_4_) & 1)) {
          *(undefined8 *)(pdVar4 + uVar14 * 8 + result_offset * 8) = uVar5;
        }
        if (auVar19._12_4_ <= auVar17._12_4_ &&
            (auVar19._8_4_ <= auVar17._8_4_ || auVar19._12_4_ != auVar17._12_4_)) {
          *(undefined8 *)(pdVar4 + uVar14 * 8 + result_offset * 8 + 8) = uVar5;
        }
        uVar14 = uVar14 + 2;
        lVar13 = auVar18._8_8_;
        auVar18._0_8_ = auVar18._0_8_ + 2;
        auVar18._8_8_ = lVar13 + 2;
      } while ((lVar12 + 1U & 0xfffffffffffffffe) != uVar14);
      pp_Var11 = (_func_int **)((long)pSVar8[5]._vptr_SegmentScanState + uVar9);
    }
    else {
      if (pp_Var11 != pSVar8[5]._vptr_SegmentScanState) {
        lVar12 = uVar10 - 1;
        auVar16._8_4_ = (int)lVar12;
        auVar16._0_8_ = lVar12;
        auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar16 = auVar16 ^ auVar6;
        uVar14 = 0;
        auVar19 = auVar7;
        do {
          auVar18 = auVar19 ^ auVar6;
          if ((bool)(~(auVar16._4_4_ < auVar18._4_4_ ||
                      auVar16._0_4_ < auVar18._0_4_ && auVar18._4_4_ == auVar16._4_4_) & 1)) {
            *(undefined8 *)(pdVar4 + uVar14 * 8 + result_offset * 8) = uVar5;
          }
          if (auVar18._12_4_ <= auVar16._12_4_ &&
              (auVar18._8_4_ <= auVar16._8_4_ || auVar18._12_4_ != auVar16._12_4_)) {
            *(undefined8 *)(pdVar4 + uVar14 * 8 + result_offset * 8 + 8) = uVar5;
          }
          uVar14 = uVar14 + 2;
          lVar12 = auVar19._8_8_;
          auVar19._0_8_ = auVar19._0_8_ + 2;
          auVar19._8_8_ = lVar12 + 2;
        } while ((uVar10 + 1 & 0xfffffffffffffffe) != uVar14);
      }
      result_offset = result_offset + uVar10;
      pSVar8[4]._vptr_SegmentScanState = (_func_int **)((long)pSVar8[4]._vptr_SegmentScanState + 1);
      pp_Var11 = (_func_int **)0x0;
    }
    pSVar8[5]._vptr_SegmentScanState = pp_Var11;
  } while (uVar10 <= uVar9);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}